

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O0

DisplayAction * addsetting(DisplayAction *__return_storage_ptr__,string *variable,string *value)

{
  offset_in_Display_to_subr in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *value_local;
  string *variable_local;
  
  local_20 = value;
  value_local = variable;
  variable_local = (string *)__return_storage_ptr__;
  std::operator+(&local_80,"set ",variable);
  std::operator+(&local_60,&local_80," ");
  std::operator+(&local_40,&local_60,value);
  DisplayAction::DisplayAction(__return_storage_ptr__,0,&local_40,0,0,in_R9);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

DisplayAction addsetting( string variable, string value )
{
	return DisplayAction(0, "set " + variable + " " + value, 0, 0, &Display::addUserSetting); 
}